

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O3

int __thiscall Fl_Group::remove(Fl_Group *this,char *__filename)

{
  uint uVar1;
  Fl_Widget ***pppFVar2;
  uint uVar3;
  Fl_Widget ***__ptr;
  Fl_Widget *pFVar4;
  Fl_Widget **ppFVar5;
  int in_EAX;
  int extraout_EAX;
  ulong extraout_RAX;
  ulong uVar6;
  Fl_Widget ***pppFVar7;
  uint uVar8;
  
  uVar8 = (uint)__filename;
  if ((-1 < (int)uVar8) && (uVar3 = this->children_, (int)uVar8 < (int)uVar3)) {
    pppFVar2 = &this->array_;
    __ptr = (Fl_Widget ***)this->array_;
    pppFVar7 = __ptr;
    if (uVar3 < 2) {
      pppFVar7 = pppFVar2;
    }
    uVar6 = (ulong)__filename & 0xffffffff;
    pFVar4 = (Fl_Widget *)pppFVar7[uVar6];
    if (pFVar4 == this->savedfocus_) {
      this->savedfocus_ = (Fl_Widget *)0x0;
    }
    if (pFVar4->parent_ == this) {
      pFVar4->parent_ = (Fl_Group *)0x0;
    }
    uVar1 = uVar3 - 1;
    this->children_ = uVar1;
    if (uVar1 == 1) {
      ppFVar5 = __ptr[uVar8 == 0];
      free(__ptr);
      *pppFVar2 = ppFVar5;
      uVar6 = extraout_RAX;
    }
    else if (uVar8 < uVar1 && 2 < uVar3) {
      uVar6 = uVar6 + 1;
      do {
        (*pppFVar2)[uVar6 - 1] = (*pppFVar2)[uVar6];
        uVar6 = uVar6 + 1;
        uVar8 = (int)__filename + 1;
        __filename = (char *)(ulong)uVar8;
      } while ((int)uVar8 < (int)uVar1);
    }
    in_EAX = (int)uVar6;
    if (this->sizes_ != (int *)0x0) {
      operator_delete__(this->sizes_);
      in_EAX = extraout_EAX;
    }
    this->sizes_ = (int *)0x0;
  }
  return in_EAX;
}

Assistant:

void Fl_Group::remove(int index) {
  if (index < 0 || index >= children_) return;
  Fl_Widget &o = *child(index);
  if (&o == savedfocus_) savedfocus_ = 0;
  if (o.parent_ == this) {	// this should always be true
    o.parent_ = 0;
  } 

  // remove the widget from the group

  children_--;
  if (children_ == 1) { // go from 2 to 1 child
    Fl_Widget *t = array_[!index];
    free((void*)array_);
    array_ = (Fl_Widget**)t;
  } else if (children_ > 1) { // delete from array
    for (; index < children_; index++) array_[index] = array_[index+1];
  }
  init_sizes();
}